

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.h
# Opt level: O1

void __thiscall
filtered_directed_graph_t::add_filtered_edge
          (filtered_directed_graph_t *this,vertex_index_t v,vertex_index_t w,value_t filtration)

{
  iterator __position;
  bool bVar1;
  float local_c;
  
  local_c = filtration;
  bVar1 = directed_graph_t::add_edge(&this->super_directed_graph_t,v,w);
  if (bVar1) {
    if ((local_c != -3.4028235e+38) || (NAN(local_c))) {
      __position._M_current =
           (this->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&this->edge_filtration,__position,&local_c
                  );
      }
      else {
        *__position._M_current = local_c;
        (this->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
  }
  return;
}

Assistant:

void add_filtered_edge(vertex_index_t v, vertex_index_t w, value_t filtration) {
		if (directed_graph_t::add_edge(v, w) && filtration != std::numeric_limits<value_t>::lowest())
			edge_filtration.push_back(filtration);
	}